

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

bool __thiscall CCoinsViewErrorCatcher::HaveCoin(CCoinsViewErrorCatcher *this,COutPoint *outpoint)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  undefined1 in_stack_00000060 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = ExecuteBackedWrapper<CCoinsViewErrorCatcher::HaveCoin(COutPoint_const&)const::__0>
                    ((anon_class_16_2_37112d3d)in_stack_00000060,
                     (vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                     outpoint);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewErrorCatcher::HaveCoin(const COutPoint &outpoint) const {
    return ExecuteBackedWrapper([&]() { return CCoinsViewBacked::HaveCoin(outpoint); }, m_err_callbacks);
}